

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnPool.h
# Opt level: O0

void __thiscall HttpConnPool::addFreeConn(HttpConnPool *this,HttpConnPtr *conn)

{
  element_type *this_00;
  int local_1c;
  HttpConnPtr *local_18;
  HttpConnPtr *conn_local;
  HttpConnPool *this_local;
  
  local_18 = conn;
  conn_local = (HttpConnPtr *)this;
  EventLoop::assertInLoopThread(this->baseLoop_);
  std::__cxx11::list<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>::
  push_back(&this->freeConnPool_,conn);
  this_00 = std::__shared_ptr_access<HttpConn,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<HttpConn,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       conn);
  local_1c = HttpConn::id(this_00);
  std::
  unordered_map<int,_std::shared_ptr<HttpConn>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpConn>_>_>_>
  ::erase(&this->usedConnMap_,&local_1c);
  return;
}

Assistant:

void addFreeConn(HttpConnPtr conn) {
        baseLoop_->assertInLoopThread();
        freeConnPool_.push_back(conn);
        usedConnMap_.erase(conn->id());
    }